

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textures.c
# Opt level: O1

void ImageFlipVertical(Image *image)

{
  void *pvVar1;
  int iVar2;
  void *pvVar3;
  long lVar4;
  void *__dest;
  int iVar5;
  int iVar6;
  
  if (((image->data != (void *)0x0) && (image->width != 0)) && (image->height != 0)) {
    if (1 < image->mipmaps) {
      TraceLog(4,"Image manipulation only applied to base mipmap level");
    }
    if (10 < image->format) {
      TraceLog(4,"Image manipulation not supported for compressed formats");
      return;
    }
    iVar2 = GetPixelDataSize(1,1,image->format);
    iVar6 = image->width;
    iVar5 = image->height;
    pvVar3 = malloc((long)(iVar5 * iVar6 * iVar2));
    if (0 < (long)iVar5) {
      pvVar1 = image->data;
      iVar6 = iVar6 * iVar2;
      lVar4 = (long)iVar5 + 1;
      iVar5 = (iVar5 + -1) * iVar6;
      __dest = pvVar3;
      do {
        memcpy(__dest,(void *)((long)iVar5 + (long)pvVar1),(long)iVar6);
        lVar4 = lVar4 + -1;
        iVar5 = iVar5 - iVar6;
        __dest = (void *)((long)__dest + (long)iVar6);
      } while (1 < lVar4);
    }
    free(image->data);
    image->data = pvVar3;
  }
  return;
}

Assistant:

void ImageFlipVertical(Image *image)
{
    // Security check to avoid program crash
    if ((image->data == NULL) || (image->width == 0) || (image->height == 0)) return;

    if (image->mipmaps > 1) TRACELOG(LOG_WARNING, "Image manipulation only applied to base mipmap level");
    if (image->format >= PIXELFORMAT_COMPRESSED_DXT1_RGB) TRACELOG(LOG_WARNING, "Image manipulation not supported for compressed formats");
    else
    {
        int bytesPerPixel = GetPixelDataSize(1, 1, image->format);
        unsigned char *flippedData = (unsigned char *)RL_MALLOC(image->width*image->height*bytesPerPixel);

        for (int i = (image->height - 1), offsetSize = 0; i >= 0; i--)
        {
            memcpy(flippedData + offsetSize, ((unsigned char *)image->data) + i*image->width*bytesPerPixel, image->width*bytesPerPixel);
            offsetSize += image->width*bytesPerPixel;
        }

        RL_FREE(image->data);
        image->data = flippedData;
    }
}